

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall tinyusdz::Attribute::get_value<tinyusdz::value::color3f>(Attribute *this,color3f *v)

{
  float fVar1;
  value_type *pvVar2;
  optional<tinyusdz::value::color3f> ret;
  optional<tinyusdz::value::color3f> local_38;
  optional<tinyusdz::value::color3f> local_28;
  
  if (v == (color3f *)0x0) {
    local_38.has_value_ = false;
  }
  else {
    primvar::PrimVar::get_value<tinyusdz::value::color3f>(&local_38,&this->_var);
    local_28.has_value_ = local_38.has_value_;
    if (local_38.has_value_ != false) {
      local_28.contained._8_4_ = local_38.contained._8_4_;
      local_28.contained._0_8_ = local_38.contained._0_8_;
      pvVar2 = nonstd::optional_lite::optional<tinyusdz::value::color3f>::value(&local_28);
      fVar1 = pvVar2->g;
      v->r = pvVar2->r;
      v->g = fVar1;
      v->b = pvVar2->b;
    }
  }
  return local_38.has_value_;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }